

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_complib.c
# Opt level: O2

int parse(lua_State *L)

{
  ravi_State *prVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  C_MemoryAllocator allocator;
  CompilerContext ccontext;
  Ravi_CompilerInterface ravicomp_interface;
  
  pcVar4 = (char *)0x0;
  pcVar3 = luaL_checklstring(L,1,(size_t *)0x0);
  iVar2 = lua_isstring(L,2);
  if (iVar2 != 0) {
    pcVar4 = luaL_checklstring(L,2,(size_t *)0x0);
  }
  prVar1 = L->l_G->ravi_state;
  ccontext.L = L;
  ccontext.jit = prVar1;
  allocator.arena = create_mspace(0,0);
  allocator.realloc = mspace_realloc;
  allocator.calloc = mspace_calloc;
  allocator.free = mspace_free;
  allocator.create_arena = create_mspace;
  allocator.destroy_arena = destroy_mspace;
  ravicomp_interface.context = &ccontext;
  ravicomp_interface.source = pcVar3;
  ravicomp_interface.source_len = strlen(pcVar3);
  ravicomp_interface.source_name = "input";
  ravicomp_interface.compiler_options = "--dump-ast";
  ravicomp_interface.main_func_name[0] = '\0';
  ravicomp_interface.main_func_name[1] = '\0';
  ravicomp_interface.main_func_name[2] = '\0';
  ravicomp_interface.main_func_name[3] = '\0';
  ravicomp_interface.main_func_name[4] = '\0';
  ravicomp_interface.main_func_name[5] = '\0';
  ravicomp_interface.main_func_name[6] = '\0';
  ravicomp_interface.main_func_name[7] = '\0';
  ravicomp_interface.main_func_name[8] = '\0';
  ravicomp_interface.main_func_name[9] = '\0';
  ravicomp_interface.main_func_name[10] = '\0';
  ravicomp_interface.main_func_name[0xb] = '\0';
  ravicomp_interface.main_func_name[0xc] = '\0';
  ravicomp_interface.main_func_name[0xd] = '\0';
  ravicomp_interface.main_func_name[0xe] = '\0';
  ravicomp_interface.main_func_name[0xf] = '\0';
  ravicomp_interface.main_func_name[0x10] = '\0';
  ravicomp_interface.main_func_name[0x11] = '\0';
  ravicomp_interface.main_func_name[0x12] = '\0';
  ravicomp_interface.main_func_name[0x13] = '\0';
  ravicomp_interface.main_func_name[0x14] = '\0';
  ravicomp_interface.main_func_name[0x15] = '\0';
  ravicomp_interface.main_func_name[0x16] = '\0';
  ravicomp_interface.main_func_name[0x17] = '\0';
  ravicomp_interface.main_func_name[0x18] = '\0';
  ravicomp_interface.main_func_name[0x19] = '\0';
  ravicomp_interface.main_func_name[0x1a] = '\0';
  ravicomp_interface.main_func_name[0x1b] = '\0';
  ravicomp_interface.main_func_name[0x1c] = '\0';
  ravicomp_interface.main_func_name[0x1d] = '\0';
  ravicomp_interface.main_func_name[0x1e] = '\0';
  ravicomp_interface.generated_code = (char *)0x0;
  ravicomp_interface.debug_message = debug_message;
  ravicomp_interface.error_message = error_message;
  if (pcVar4 == (char *)0x0) {
    pcVar4 = (char *)prVar1->id;
    prVar1->id = (unsigned_long_long)(pcVar4 + 1);
    pcVar3 = "__luachunk_%lld";
  }
  else {
    pcVar3 = "%s";
  }
  ravicomp_interface.memory_allocator = &allocator;
  snprintf(ravicomp_interface.main_func_name,0x1f,pcVar3,pcVar4);
  iVar2 = raviX_compile(&ravicomp_interface);
  if (iVar2 == 0) {
    lua_pushstring(L,ravicomp_interface.generated_code);
    raviX_release(&ravicomp_interface);
    destroy_mspace(allocator.arena);
  }
  else {
    raviX_release(&ravicomp_interface);
    destroy_mspace(allocator.arena);
    lua_error(L);
  }
  return (uint)(iVar2 == 0);
}

Assistant:

static int parse(lua_State* L) {
  const char* s = luaL_checkstring(L, 1);
  const char* mainfunc = NULL;
  if (lua_isstring(L, 2)) {
    mainfunc = luaL_checkstring(L, 2);
  }
  struct CompilerContext ccontext = {.L = L, .jit = G(L)->ravi_state};
  C_MemoryAllocator allocator = {.arena = create_mspace(0, 0),
                                 .create_arena = create_mspace,
                                 .destroy_arena = destroy_mspace,
                                 .calloc = mspace_calloc,
                                 .realloc = mspace_realloc,
                                 .free = mspace_free};
  struct Ravi_CompilerInterface ravicomp_interface = {.source = s,
                                                      .source_len = strlen(s),
                                                      .source_name = "input",
                                                      .generated_code = NULL,
                                                      .context = &ccontext,
                                                      .compiler_options = "--dump-ast",
                                                      .memory_allocator = &allocator,
                                                      .debug_message = debug_message,
                                                      .error_message = error_message};
  if (mainfunc) {
    snprintf(ravicomp_interface.main_func_name, sizeof ravicomp_interface.main_func_name, "%s", mainfunc);
  }
  else {
#ifdef USE_MIRJIT
    snprintf(ravicomp_interface.main_func_name, sizeof ravicomp_interface.main_func_name, "__luachunk_%lld",
             ccontext.jit->id++);
#else
    snprintf(ravicomp_interface.main_func_name, sizeof ravicomp_interface.main_func_name, "mymain");
#endif
  }
  int rc = raviX_compile(&ravicomp_interface);
  if (rc == 0) {
    lua_pushstring(L, ravicomp_interface.generated_code);
    raviX_release(&ravicomp_interface);
    destroy_mspace(allocator.arena);
    return 1;
  }
  else {
    raviX_release(&ravicomp_interface);
    destroy_mspace(allocator.arena);
    lua_error(L);
    return 0;
  }
}